

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_CPS(DisasContext_conflict1 *s,arg_CPS *a)

{
  uint uVar1;
  uint32_t val;
  undefined4 in_EDX;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  
  uVar3 = (uint)s->features & 0x208;
  if ((uVar3 != 8) || (s->user != 0)) goto LAB_005ece11;
  if ((a->imod & 2U) == 0) {
    val = 0;
    uVar1 = 0;
    if (a->M == 0) goto LAB_005ece11;
LAB_005ece02:
    uVar1 = uVar1 | 0x1f;
    val = val | a->mode;
  }
  else {
    auVar5._0_4_ = -(uint)(a->A == 0);
    auVar5._4_4_ = -(uint)(a->F == 0);
    auVar5._8_4_ = -(uint)(a->I == 0);
    auVar5._12_4_ = -(uint)(a->M == 0);
    uVar2 = movmskps(in_EDX,auVar5);
    uVar1 = ((byte)~(byte)uVar2 & 1) * 0x100;
    uVar4 = uVar1 + 0x80;
    if ((uVar2 & 4) != 0) {
      uVar4 = uVar1;
    }
    uVar1 = uVar4 + 0x40;
    if ((uVar2 & 2) != 0) {
      uVar1 = uVar4;
    }
    val = -(a->imod & 1U) & uVar1;
    if ((uVar2 & 8) == 0) goto LAB_005ece02;
    if (uVar1 == 0) goto LAB_005ece11;
  }
  gen_set_psr_im(s,uVar1,0,val);
LAB_005ece11:
  return uVar3 == 8;
}

Assistant:

static bool trans_CPS(DisasContext *s, arg_CPS *a)
{
    uint32_t mask, val;

    if (!ENABLE_ARCH_6 || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (IS_USER(s)) {
        /* Implemented as NOP in user mode.  */
        return true;
    }
    /* TODO: There are quite a lot of UNPREDICTABLE argument combinations. */

    mask = val = 0;
    if (a->imod & 2) {
        if (a->A) {
            mask |= CPSR_A;
        }
        if (a->I) {
            mask |= CPSR_I;
        }
        if (a->F) {
            mask |= CPSR_F;
        }
        if (a->imod & 1) {
            val |= mask;
        }
    }
    if (a->M) {
        mask |= CPSR_M;
        val |= a->mode;
    }
    if (mask) {
        gen_set_psr_im(s, mask, 0, val);
    }
    return true;
}